

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O3

value * __thiscall cppcms::json::value::operator[](value *this,string *name)

{
  variant *this_00;
  _Rb_tree<cppcms::string_key,_std::pair<const_cppcms::string_key,_cppcms::json::value>,_std::_Select1st<std::pair<const_cppcms::string_key,_cppcms::json::value>_>,_std::less<cppcms::string_key>,_std::allocator<std::pair<const_cppcms::string_key,_cppcms::json::value>_>_>
  *this_01;
  const_iterator cVar1;
  bad_value_cast *pbVar2;
  long *plVar3;
  long *plVar4;
  undefined1 local_78 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  this_00 = &((this->d).d.ptr_)->value_;
  if (this_00->type != is_object) {
    pbVar2 = (bad_value_cast *)__cxa_allocate_exception(0x48);
    local_78._0_8_ = local_78 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"");
    bad_value_cast::bad_value_cast
              (pbVar2,(string *)local_78,(((this->d).d.ptr_)->value_).type,is_object);
    __cxa_throw(pbVar2,&bad_value_cast::typeinfo,bad_value_cast::~bad_value_cast);
  }
  this_01 = &variant::
             get<std::map<cppcms::string_key,cppcms::json::value,std::less<cppcms::string_key>,std::allocator<std::pair<cppcms::string_key_const,cppcms::json::value>>>>
                       (this_00)->_M_t;
  local_78._0_8_ = (name->_M_dataplus)._M_p;
  local_78._8_8_ = local_78._0_8_ + name->_M_string_length;
  local_78._24_8_ = 0;
  local_58._M_local_buf[0] = '\0';
  local_78._16_8_ = &local_58;
  cVar1 = std::
          _Rb_tree<cppcms::string_key,_std::pair<const_cppcms::string_key,_cppcms::json::value>,_std::_Select1st<std::pair<const_cppcms::string_key,_cppcms::json::value>_>,_std::less<cppcms::string_key>,_std::allocator<std::pair<const_cppcms::string_key,_cppcms::json::value>_>_>
          ::find(this_01,(key_type *)local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._16_8_ != &local_58) {
    operator_delete((void *)local_78._16_8_);
  }
  if ((_Rb_tree_header *)cVar1._M_node != &(this_01->_M_impl).super__Rb_tree_header) {
    return (value *)&cVar1._M_node[2]._M_left;
  }
  pbVar2 = (bad_value_cast *)__cxa_allocate_exception(0x48);
  std::operator+(&local_48,"Member ",name);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_48);
  local_78._0_8_ = *plVar3;
  plVar4 = plVar3 + 2;
  if ((long *)local_78._0_8_ == plVar4) {
    local_78._16_8_ = *plVar4;
    local_78._24_8_ = plVar3[3];
    local_78._0_8_ = local_78 + 0x10;
  }
  else {
    local_78._16_8_ = *plVar4;
  }
  local_78._8_8_ = plVar3[1];
  *plVar3 = (long)plVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  bad_value_cast::bad_value_cast(pbVar2,(string *)local_78);
  __cxa_throw(pbVar2,&bad_value_cast::typeinfo,bad_value_cast::~bad_value_cast);
}

Assistant:

value const &value::operator[](std::string const &name) const
	{
		if(type()!=json::is_object)
			throw bad_value_cast("",type(),json::is_object);
		json::object const &self=object();
		json::object::const_iterator p=self.find(string_key::unowned(name));
		if(p==self.end())
			throw bad_value_cast("Member "+name+" not found");
		return p->second;
	}